

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cpp
# Opt level: O0

unsigned_long_long measure(string *what,function<unsigned_long_long_()> *cb)

{
  ostream *poVar1;
  rep rVar2;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_40;
  duration<long,_std::ratio<1L,_1000000000L>_> local_38;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  unsigned_long_long local_28;
  unsigned_long_long result;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  start;
  function<unsigned_long_long_()> *cb_local;
  string *what_local;
  
  start.__d.__r = (duration)(duration)cb;
  result = std::chrono::_V2::system_clock::now();
  local_28 = std::function<unsigned_long_long_()>::operator()
                       ((function<unsigned_long_long_()> *)start.__d.__r);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)what);
  poVar1 = std::operator<<(poVar1," took ");
  local_40.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_38.__r = (rep)std::chrono::operator-
                                (&local_40,
                                 (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&result);
  local_30.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_38);
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  poVar1 = std::operator<<(poVar1," ms");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return local_28;
}

Assistant:

static unsigned long long measure(std::string const& what, std::function<unsigned long long()> const& cb) {
  typedef std::chrono::high_resolution_clock clock;
  std::chrono::time_point<clock> start = clock::now();

  unsigned long long result = cb();

  std::cout << what << " took "
            << std::chrono::duration_cast<std::chrono::milliseconds>(clock::now() - start).count() << " ms" 
            << std::endl;

  return result;
}